

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O0

int Gia_ManSwiSimInfoCountTrans(Gia_ManSwi_t *p,int iPlace)

{
  int iVar1;
  uint *puVar2;
  int local_28;
  int local_24;
  int Counter;
  int w;
  uint *pInfo;
  int iPlace_local;
  Gia_ManSwi_t *p_local;
  
  local_28 = 0;
  puVar2 = Gia_SwiData(p,iPlace);
  local_24 = p->nWords;
  while (local_24 = local_24 + -1, -1 < local_24) {
    iVar1 = Gia_WordCountOnes((puVar2[local_24] ^ puVar2[local_24] >> 0x10) & 0xffff);
    local_28 = iVar1 * 2 + local_28;
  }
  return local_28;
}

Assistant:

static inline int Gia_ManSwiSimInfoCountTrans( Gia_ManSwi_t * p, int iPlace )
{
    unsigned * pInfo;
    int w, Counter = 0;
    pInfo = Gia_SwiData( p, iPlace );
    for ( w = p->nWords-1; w >= 0; w-- )
        Counter += 2*Gia_WordCountOnes( (pInfo[w] ^ (pInfo[w] >> 16)) & 0xffff );
    return Counter;
}